

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::GetNestedMessageName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Descriptor *descriptor)

{
  string *str;
  FileDescriptor *this_00;
  string *prefix;
  ulong uVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_2d;
  allocator local_19;
  _anonymous_namespace_ *local_18;
  Descriptor *descriptor_local;
  string *result;
  
  local_18 = this;
  descriptor_local = (Descriptor *)__return_storage_ptr__;
  if (this == (_anonymous_namespace_ *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    local_2d = 0;
    str = Descriptor::full_name_abi_cxx11_((Descriptor *)this);
    this_00 = Descriptor::file((Descriptor *)local_18);
    prefix = FileDescriptor::package_abi_cxx11_(this_00);
    StripPrefixString(__return_storage_ptr__,str,prefix);
    uVar1 = std::__cxx11::string::empty();
    if (((uVar1 & 1) == 0) &&
       (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__),
       *pcVar2 != '.')) {
      std::operator+(&local_50,".",__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string GetNestedMessageName(const Descriptor* descriptor) {
  if (descriptor == NULL) {
    return "";
  }
  string result =
      StripPrefixString(descriptor->full_name(), descriptor->file()->package());
  // Add a leading dot if one is not already present.
  if (!result.empty() && result[0] != '.') {
    result = "." + result;
  }
  return result;
}